

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRec3.c
# Opt level: O3

void Lms_ManStop(Lms_Man_t *p)

{
  Vec_Mem_t *pVVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Wrd_t *__ptr;
  Vec_Str_t *__ptr_00;
  Vec_Int_t *pVVar4;
  long lVar5;
  
  pVVar4 = p->vLabels;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      p->vLabels->pArray = (int *)0x0;
      pVVar4 = p->vLabels;
      if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_00288874;
    }
    free(pVVar4);
    p->vLabels = (Vec_Int_t *)0x0;
  }
LAB_00288874:
  pVVar3 = p->vLabelsP;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    if (pVVar3->pArray != (void **)0x0) {
      free(pVVar3->pArray);
      p->vLabelsP->pArray = (void **)0x0;
      pVVar3 = p->vLabelsP;
      if (pVVar3 == (Vec_Ptr_t *)0x0) goto LAB_002888b0;
    }
    free(pVVar3);
    p->vLabelsP = (Vec_Ptr_t *)0x0;
  }
LAB_002888b0:
  pVVar3 = p->vNodes;
  if (pVVar3 != (Vec_Ptr_t *)0x0) {
    if (pVVar3->pArray != (void **)0x0) {
      free(pVVar3->pArray);
      p->vNodes->pArray = (void **)0x0;
      pVVar3 = p->vNodes;
      if (pVVar3 == (Vec_Ptr_t *)0x0) goto LAB_002888ec;
    }
    free(pVVar3);
    p->vNodes = (Vec_Ptr_t *)0x0;
  }
LAB_002888ec:
  pVVar4 = p->vTruthPo;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      p->vTruthPo->pArray = (int *)0x0;
      pVVar4 = p->vTruthPo;
      if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_00288928;
    }
    free(pVVar4);
    p->vTruthPo = (Vec_Int_t *)0x0;
  }
LAB_00288928:
  __ptr = p->vDelays;
  if (__ptr != (Vec_Wrd_t *)0x0) {
    if (__ptr->pArray != (word *)0x0) {
      free(__ptr->pArray);
      p->vDelays->pArray = (word *)0x0;
      __ptr = p->vDelays;
      if (__ptr == (Vec_Wrd_t *)0x0) goto LAB_00288964;
    }
    free(__ptr);
    p->vDelays = (Vec_Wrd_t *)0x0;
  }
LAB_00288964:
  __ptr_00 = p->vAreas;
  if (__ptr_00 != (Vec_Str_t *)0x0) {
    if (__ptr_00->pArray != (char *)0x0) {
      free(__ptr_00->pArray);
      p->vAreas->pArray = (char *)0x0;
      __ptr_00 = p->vAreas;
      if (__ptr_00 == (Vec_Str_t *)0x0) goto LAB_002889a0;
    }
    free(__ptr_00);
    p->vAreas = (Vec_Str_t *)0x0;
  }
LAB_002889a0:
  pVVar4 = p->vFreqs;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      p->vFreqs->pArray = (int *)0x0;
      pVVar4 = p->vFreqs;
      if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_002889dc;
    }
    free(pVVar4);
    p->vFreqs = (Vec_Int_t *)0x0;
  }
LAB_002889dc:
  pVVar4 = p->vTruthFreqs;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      p->vTruthFreqs->pArray = (int *)0x0;
      pVVar4 = p->vTruthFreqs;
      if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_00288a18;
    }
    free(pVVar4);
    p->vTruthFreqs = (Vec_Int_t *)0x0;
  }
LAB_00288a18:
  pVVar4 = p->vTruthIds;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      p->vTruthIds->pArray = (int *)0x0;
      pVVar4 = p->vTruthIds;
      if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_00288a54;
    }
    free(pVVar4);
    p->vTruthIds = (Vec_Int_t *)0x0;
  }
LAB_00288a54:
  pVVar1 = p->vTtMem;
  if (pVVar1 == (Vec_Mem_t *)0x0) goto LAB_00288ad5;
  pVVar4 = pVVar1->vTable;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      pVVar1->vTable->pArray = (int *)0x0;
      pVVar4 = pVVar1->vTable;
      if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_00288a99;
    }
    free(pVVar4);
    pVVar1->vTable = (Vec_Int_t *)0x0;
  }
LAB_00288a99:
  pVVar4 = pVVar1->vNexts;
  if (pVVar4 != (Vec_Int_t *)0x0) {
    if (pVVar4->pArray != (int *)0x0) {
      free(pVVar4->pArray);
      pVVar1->vNexts->pArray = (int *)0x0;
      pVVar4 = pVVar1->vNexts;
      if (pVVar4 == (Vec_Int_t *)0x0) goto LAB_00288ad5;
    }
    free(pVVar4);
    pVVar1->vNexts = (Vec_Int_t *)0x0;
  }
LAB_00288ad5:
  pVVar1 = p->vTtMem;
  iVar2 = pVVar1->iPage;
  if (-1 < iVar2) {
    lVar5 = -1;
    do {
      if (pVVar1->ppPages[lVar5 + 1] != (word *)0x0) {
        free(pVVar1->ppPages[lVar5 + 1]);
        pVVar1->ppPages[lVar5 + 1] = (word *)0x0;
        iVar2 = pVVar1->iPage;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar2);
  }
  if (pVVar1->ppPages != (word **)0x0) {
    free(pVVar1->ppPages);
  }
  free(pVVar1);
  Gia_ManStopP(&p->pGia);
  if (p != (Lms_Man_t *)0x0) {
    free(p);
    return;
  }
  return;
}

Assistant:

void Lms_ManStop( Lms_Man_t * p )
{
    // temporaries
    Vec_IntFreeP( &p->vLabels );
    Vec_PtrFreeP( &p->vLabelsP );
    Vec_PtrFreeP( &p->vNodes );
    // internal data for AIG level minimization
    Vec_IntFreeP( &p->vTruthPo );
    Vec_WrdFreeP( &p->vDelays );
    Vec_StrFreeP( &p->vAreas );
    Vec_IntFreeP( &p->vFreqs );
    Vec_IntFreeP( &p->vTruthFreqs );
    // internal data for library construction
    Vec_IntFreeP( &p->vTruthIds );
    Vec_MemHashFree( p->vTtMem );
//    Vec_MemHashFree( p->vTtMem2 );
    Vec_MemFree( p->vTtMem );
//    Vec_MemFree( p->vTtMem2 );
    Gia_ManStopP( &p->pGia );
    ABC_FREE( p );
}